

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OffsetTable.cpp
# Opt level: O3

void __thiscall
ser::OffsetTable::AddFieldRecord
          (OffsetTable *this,int savepointID,string *fieldName,offset_t offset,checksum_t *checksum)

{
  pointer pmVar1;
  mapped_type *pmVar2;
  ostream *poVar3;
  SerializationException *this_00;
  ulong uVar4;
  SerializationException exception;
  OffsetTableEntryValue value;
  undefined1 *local_1f0;
  undefined1 local_1e0 [16];
  undefined **local_1d0;
  _Alloc_hider local_1c8;
  size_type local_1c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1b8;
  offset_t local_1a8;
  undefined1 *local_1a0;
  undefined8 local_198;
  undefined1 local_190 [352];
  
  pmVar1 = (this->entries_).
           super__Vector_base<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ser::OffsetTable::OffsetTableEntryValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ser::OffsetTable::OffsetTableEntryValue>_>_>,_std::allocator<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ser::OffsetTable::OffsetTableEntryValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ser::OffsetTable::OffsetTableEntryValue>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  uVar4 = ((long)(this->entries_).
                 super__Vector_base<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ser::OffsetTable::OffsetTableEntryValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ser::OffsetTable::OffsetTableEntryValue>_>_>,_std::allocator<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ser::OffsetTable::OffsetTableEntryValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ser::OffsetTable::OffsetTableEntryValue>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish - (long)pmVar1 >> 4) *
          -0x5555555555555555;
  if ((uint)savepointID <= uVar4 && uVar4 - (uint)savepointID != 0) {
    local_198 = 0;
    local_190[0] = 0;
    local_1a8 = offset;
    local_1a0 = local_190;
    std::__cxx11::string::_M_assign((string *)&local_1a0);
    pmVar2 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ser::OffsetTable::OffsetTableEntryValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ser::OffsetTable::OffsetTableEntryValue>_>_>
             ::operator[](pmVar1 + savepointID,fieldName);
    pmVar2->offset = local_1a8;
    std::__cxx11::string::_M_assign((string *)&pmVar2->checksum);
    if (local_1a0 != local_190) {
      operator_delete(local_1a0);
    }
    return;
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_1a8,"Error: savepoint with ID ",0x19);
  poVar3 = (ostream *)std::ostream::operator<<((ostream *)&local_1a8,savepointID);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3," is not registered in table\n",0x1c);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"Saving the field ",0x11);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar3,(fieldName->_M_dataplus)._M_p,fieldName->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3," at offset ",0xb);
  poVar3 = std::ostream::_M_insert<long>((long)poVar3);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3," is not possible\n",0x11);
  local_1c8._M_p = (pointer)&local_1b8;
  local_1d0 = &PTR__SerializationException_001348f0;
  local_1c0 = 0;
  local_1b8._M_local_buf[0] = '\0';
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::_M_assign((string *)&local_1c8);
  if (local_1f0 != local_1e0) {
    operator_delete(local_1f0);
  }
  this_00 = (SerializationException *)__cxa_allocate_exception(0x28);
  SerializationException::SerializationException(this_00,(SerializationException *)&local_1d0);
  __cxa_throw(this_00,&SerializationException::typeinfo,
              SerializationException::~SerializationException);
}

Assistant:

void OffsetTable::AddFieldRecord(int savepointID, const std::string& fieldName,
                                 offset_t offset, const checksum_t& checksum)
{
    // Check that ID is valid
    if (static_cast<unsigned>(savepointID) >= entries_.size())
    {
        std::ostringstream msg;
        msg << "Error: savepoint with ID " << savepointID << " is not registered in table\n"
            << "Saving the field " << fieldName << " at offset " << offset << " is not possible\n";
        SerializationException exception;
        exception.Init(msg.str());
        throw exception;
    }

    // Find the right row of the table
    OffsetTableEntry& entry = entries_[savepointID];

    // Set the offset of the record
    // If the recod already exists, it is overwritten
    OffsetTableEntryValue value;
    value.offset = offset;
    value.checksum = checksum;
    entry[fieldName] = value;
}